

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_negation.c
# Opt level: O2

int run_container_negation_range
              (run_container_t *src,int range_start,int range_end,container_t **dst)

{
  undefined8 in_RAX;
  run_container_t *prVar1;
  container_t *pcVar2;
  long lVar3;
  undefined8 uStack_38;
  uint8_t return_typecode;
  
  if (range_start < range_end) {
    uStack_38 = in_RAX;
    prVar1 = run_container_create_given_capacity(src->n_runs + 1);
    lVar3 = 0;
    while ((lVar3 < src->n_runs && ((int)(uint)src->runs[lVar3].value < range_start))) {
      prVar1->runs[lVar3] = src->runs[lVar3];
      prVar1->n_runs = prVar1->n_runs + 1;
      lVar3 = lVar3 + 1;
    }
    run_container_smart_append_exclusive
              (prVar1,(ushort)range_start,~(ushort)range_start + (short)range_end);
    for (; lVar3 < src->n_runs; lVar3 = lVar3 + 1) {
      run_container_smart_append_exclusive(prVar1,src->runs[lVar3].value,src->runs[lVar3].length);
    }
    pcVar2 = convert_run_to_efficient_container(prVar1,&return_typecode);
    *dst = pcVar2;
    if (return_typecode != '\x03') {
      run_container_free(prVar1);
      return (uint)return_typecode;
    }
  }
  else {
    prVar1 = run_container_clone(src);
    *dst = prVar1;
  }
  return 3;
}

Assistant:

int run_container_negation_range(const run_container_t *src,
                                 const int range_start, const int range_end,
                                 container_t **dst) {
    uint8_t return_typecode;

    // follows the Java implementation
    if (range_end <= range_start) {
        *dst = run_container_clone(src);
        return RUN_CONTAINER_TYPE;
    }

    run_container_t *ans = run_container_create_given_capacity(
        src->n_runs + 1);  // src->n_runs + 1);
    int k = 0;
    for (; k < src->n_runs && src->runs[k].value < range_start; ++k) {
        ans->runs[k] = src->runs[k];
        ans->n_runs++;
    }

    run_container_smart_append_exclusive(
        ans, (uint16_t)range_start, (uint16_t)(range_end - range_start - 1));

    for (; k < src->n_runs; ++k) {
        run_container_smart_append_exclusive(ans, src->runs[k].value,
                                             src->runs[k].length);
    }

    *dst = convert_run_to_efficient_container(ans, &return_typecode);
    if (return_typecode != RUN_CONTAINER_TYPE) run_container_free(ans);

    return return_typecode;
}